

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O2

size_t mp_vformat(char *data,size_t data_size,char *format,__va_list_tag *vl)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint32_t uVar4;
  mp_double_cast cast;
  int *piVar5;
  long lVar6;
  undefined8 *puVar7;
  double *pdVar8;
  uint *puVar9;
  size_t sVar10;
  uint64_t *puVar11;
  ulong *puVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  uint64_t num;
  char *pcVar16;
  uint uVar17;
  void *__src;
  bool bVar18;
  char *pcVar19;
  size_t sVar20;
  float fVar21;
  char *local_48;
  char *end;
  ulong local_38;
  
  sVar20 = 0;
  end = (char *)vl;
  local_38 = data_size;
  do {
    cVar2 = *format;
    if (cVar2 != '%') {
      pcVar19 = format;
      if (cVar2 == 'N') {
        if ((format[1] == 'I') && (format[2] == 'L')) {
          sVar20 = sVar20 + 1;
          pcVar19 = format + 2;
          if (sVar20 <= local_38) {
            *data = 0xc0;
            data = (char *)((byte *)data + 1);
          }
        }
      }
      else if (cVar2 == '[') {
        uVar17 = 0;
        iVar3 = 1;
        pcVar16 = format;
LAB_001141c4:
        pcVar14 = pcVar16;
        if (iVar3 != 0) {
          pcVar1 = pcVar14 + 1;
          cVar2 = *pcVar1;
          pcVar16 = pcVar1;
          if (cVar2 == '%') break;
          if (cVar2 == 'N') {
            if (pcVar14[2] == 'I') {
              bVar18 = iVar3 == 1 && pcVar14[3] == 'L';
              goto LAB_00114261;
            }
          }
          else {
            if (cVar2 != '[') {
              if (cVar2 != ']') {
                if (cVar2 == '{') goto LAB_00114200;
                if (cVar2 != '}') {
                  if (cVar2 == '\0') {
                    pcVar19 = "level == 0";
                    uVar17 = 0x5e;
                    goto LAB_0011492b;
                  }
                  goto LAB_001141c4;
                }
              }
              iVar3 = iVar3 + -1;
              if ((iVar3 == 0) && (iVar3 = 0, cVar2 != ']')) {
                pcVar19 = "level || *e == \']\'";
                uVar17 = 0x52;
                goto LAB_0011492b;
              }
              goto LAB_001141c4;
            }
LAB_00114200:
            uVar17 = uVar17 + (iVar3 == 1);
            iVar3 = iVar3 + 1;
          }
          goto LAB_001141c4;
        }
        lVar6 = (ulong)(0xffff < uVar17) * 2 + 3;
        if (uVar17 < 0x10) {
          lVar6 = 1;
        }
        sVar20 = sVar20 + lVar6;
        if (sVar20 <= local_38) {
          data = mp_encode_array(data,uVar17);
        }
      }
      else if (cVar2 == '{') {
        uVar17 = 0;
        iVar3 = 1;
        pcVar16 = format;
LAB_00114115:
        pcVar14 = pcVar16;
        if (iVar3 != 0) {
          pcVar1 = pcVar14 + 1;
          cVar2 = *pcVar1;
          pcVar16 = pcVar1;
          if (cVar2 == '%') goto LAB_0011419b;
          if (cVar2 == 'N') {
            if (pcVar14[2] == 'I') {
              bVar18 = iVar3 == 1 && pcVar14[3] == 'L';
              goto LAB_001141b2;
            }
          }
          else {
            if (cVar2 != '[') {
              if (cVar2 != ']') {
                if (cVar2 == '{') goto LAB_00114151;
                if (cVar2 != '}') {
                  if (cVar2 == '\0') {
                    pcVar19 = "level == 0";
                    uVar17 = 0x7b;
                    goto LAB_0011492b;
                  }
                  goto LAB_00114115;
                }
              }
              iVar3 = iVar3 + -1;
              if ((iVar3 == 0) && (iVar3 = 0, cVar2 != '}')) {
                pcVar19 = "level || *e == \'}\'";
                uVar17 = 0x6f;
                goto LAB_0011492b;
              }
              goto LAB_00114115;
            }
LAB_00114151:
            uVar17 = uVar17 + (iVar3 == 1);
            iVar3 = iVar3 + 1;
          }
          goto LAB_00114115;
        }
        if ((uVar17 & 1) != 0) {
          pcVar19 = "count % 2 == 0";
          uVar17 = 0x7d;
LAB_0011492b:
          __assert_fail(pcVar19,
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                        ,uVar17,
                        "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)");
        }
        lVar6 = (ulong)(0x1ffff < uVar17) * 2 + 3;
        if (uVar17 < 0x20) {
          lVar6 = 1;
        }
        sVar20 = sVar20 + lVar6;
        if (sVar20 <= local_38) {
          data = mp_encode_map(data,uVar17 >> 1);
        }
      }
      else if (cVar2 == '\0') {
        return sVar20;
      }
      goto LAB_00114319;
    }
    pcVar19 = format + 1;
    cVar2 = format[1];
    switch(cVar2) {
    case 'b':
      uVar17 = vl->gp_offset;
      if ((ulong)uVar17 < 0x29) {
        piVar5 = (int *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->gp_offset = uVar17 + 8;
      }
      else {
        piVar5 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar5 + 2;
      }
      sVar20 = sVar20 + 1;
      if (sVar20 <= local_38) {
        *data = *piVar5 != 0 | 0xc2;
        data = (char *)((byte *)data + 1);
      }
      break;
    case 'c':
    case 'e':
    case 'g':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'q':
    case 'r':
    case 't':
switchD_00114290_caseD_63:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                    ,0xe5,"size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
      ;
    case 'f':
      uVar17 = vl->fp_offset;
      if ((ulong)uVar17 < 0xa1) {
        pdVar8 = (double *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->fp_offset = uVar17 + 0x10;
      }
      else {
        pdVar8 = (double *)vl->overflow_arg_area;
        vl->overflow_arg_area = pdVar8 + 1;
      }
      sVar20 = sVar20 + 5;
      if (sVar20 <= local_38) {
        fVar21 = (float)*pdVar8;
        *data = 0xca;
        *(uint *)((byte *)data + 1) =
             (uint)fVar21 >> 0x18 | ((uint)fVar21 & 0xff0000) >> 8 | ((uint)fVar21 & 0xff00) << 8 |
             (int)fVar21 << 0x18;
        data = (char *)((byte *)data + 5);
      }
      break;
    case 'h':
      pcVar19 = format + 2;
      cVar2 = format[2];
      if (cVar2 != 'd') {
        if (cVar2 == 'h') {
          if ((format[3] == 'i') || (format[3] == 'd')) {
            uVar17 = vl->gp_offset;
            if ((ulong)uVar17 < 0x29) {
              piVar5 = (int *)((ulong)uVar17 + (long)vl->reg_save_area);
              vl->gp_offset = uVar17 + 8;
            }
            else {
              piVar5 = (int *)vl->overflow_arg_area;
              vl->overflow_arg_area = piVar5 + 2;
            }
            num = (uint64_t)*piVar5;
            goto LAB_00114845;
          }
          if (format[3] != 'u') goto switchD_00114290_caseD_63;
          uVar17 = vl->gp_offset;
          if ((ulong)uVar17 < 0x29) {
            puVar9 = (uint *)((ulong)uVar17 + (long)vl->reg_save_area);
            vl->gp_offset = uVar17 + 8;
          }
          else {
            puVar9 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar9 + 2;
          }
          num = (uint64_t)*puVar9;
LAB_00114896:
          pcVar19 = format + 3;
          goto LAB_001144d5;
        }
        if (cVar2 == 'u') goto switchD_00114290_caseD_75;
        if (cVar2 != 'i') goto switchD_00114290_caseD_63;
      }
    case 'd':
    case 'i':
      uVar17 = vl->gp_offset;
      if ((ulong)uVar17 < 0x29) {
        piVar5 = (int *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->gp_offset = uVar17 + 8;
      }
      else {
        piVar5 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar5 + 2;
      }
      num = (uint64_t)*piVar5;
LAB_00114394:
      if ((long)num < 0) {
        uVar4 = mp_sizeof_int(num);
        sVar20 = sVar20 + uVar4;
        vl = (__va_list_tag *)end;
        if (sVar20 <= local_38) {
          data = mp_encode_int(data,num);
          vl = (__va_list_tag *)end;
        }
      }
      else {
LAB_001144d5:
        uVar4 = mp_sizeof_uint(num);
        sVar20 = sVar20 + uVar4;
        vl = (__va_list_tag *)end;
        if (sVar20 <= local_38) {
          data = mp_encode_uint(data,num);
          vl = (__va_list_tag *)end;
        }
      }
      break;
    case 'l':
      pcVar19 = format + 2;
      switch(format[2]) {
      case 'd':
      case 'i':
        uVar17 = vl->gp_offset;
        if ((ulong)uVar17 < 0x29) {
          puVar11 = (uint64_t *)((ulong)uVar17 + (long)vl->reg_save_area);
          vl->gp_offset = uVar17 + 8;
        }
        else {
          puVar11 = (uint64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar11 + 1;
        }
        num = *puVar11;
        break;
      case 'e':
      case 'g':
      case 'h':
      case 'j':
      case 'k':
        goto switchD_00114290_caseD_63;
      case 'f':
        uVar17 = vl->fp_offset;
        if ((ulong)uVar17 < 0xa1) {
          puVar12 = (ulong *)((ulong)uVar17 + (long)vl->reg_save_area);
          vl->fp_offset = uVar17 + 0x10;
        }
        else {
          puVar12 = (ulong *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar12 + 1;
        }
        sVar20 = sVar20 + 9;
        if (sVar20 <= local_38) {
          uVar13 = *puVar12;
          *data = 0xcb;
          *(ulong *)((byte *)data + 1) =
               uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
               (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
               (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28
               | uVar13 << 0x38;
          data = (char *)((byte *)data + 9);
        }
        goto LAB_00114319;
      case 'l':
        if ((format[3] != 'i') && (format[3] != 'd')) {
          if (format[3] != 'u') goto switchD_00114290_caseD_63;
          uVar17 = vl->gp_offset;
          if ((ulong)uVar17 < 0x29) {
            puVar11 = (uint64_t *)((ulong)uVar17 + (long)vl->reg_save_area);
            vl->gp_offset = uVar17 + 8;
          }
          else {
            puVar11 = (uint64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar11 + 1;
          }
          num = *puVar11;
          goto LAB_00114896;
        }
        uVar17 = vl->gp_offset;
        if ((ulong)uVar17 < 0x29) {
          puVar11 = (uint64_t *)((ulong)uVar17 + (long)vl->reg_save_area);
          vl->gp_offset = uVar17 + 8;
        }
        else {
          puVar11 = (uint64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar11 + 1;
        }
        num = *puVar11;
LAB_00114845:
        pcVar19 = format + 3;
        break;
      default:
        if (format[2] != 'u') goto switchD_00114290_caseD_63;
        uVar17 = vl->gp_offset;
        if ((ulong)uVar17 < 0x29) {
          puVar11 = (uint64_t *)((ulong)uVar17 + (long)vl->reg_save_area);
          vl->gp_offset = uVar17 + 8;
        }
        else {
          puVar11 = (uint64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar11 + 1;
        }
        num = *puVar11;
        goto LAB_001144d5;
      }
      goto LAB_00114394;
    case 'p':
      uVar17 = vl->gp_offset;
      if ((ulong)uVar17 < 0x29) {
        puVar7 = (undefined8 *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->gp_offset = uVar17 + 8;
      }
      else {
        puVar7 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar7 + 1;
      }
      pcVar16 = (char *)*puVar7;
      local_48 = pcVar16;
      mp_next(&local_48);
      sVar10 = (size_t)(uint)((int)local_48 - (int)pcVar16);
      sVar20 = sVar20 + sVar10;
      vl = (__va_list_tag *)end;
      if (sVar20 <= local_38) {
LAB_001145fe:
        memcpy(data,pcVar16,sVar10);
        data = (char *)((byte *)data + sVar10);
        vl = (__va_list_tag *)end;
      }
      break;
    case 's':
      uVar17 = vl->gp_offset;
      if ((ulong)uVar17 < 0x29) {
        puVar7 = (undefined8 *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->gp_offset = uVar17 + 8;
      }
      else {
        puVar7 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar7 + 1;
      }
      pcVar16 = (char *)*puVar7;
      sVar10 = strlen(pcVar16);
      iVar3 = 1;
      uVar17 = (uint)sVar10;
      if ((0x1f < uVar17) && (iVar3 = 2, 0xff < uVar17)) {
        iVar3 = (uint)(0xffff < uVar17) * 2 + 3;
      }
      sVar20 = sVar20 + (iVar3 + uVar17);
      vl = (__va_list_tag *)end;
      if (sVar20 <= local_38) {
        data = mp_encode_strl(data,uVar17);
        sVar10 = sVar10 & 0xffffffff;
        goto LAB_001145fe;
      }
      break;
    case 'u':
switchD_00114290_caseD_75:
      uVar17 = vl->gp_offset;
      if ((ulong)uVar17 < 0x29) {
        puVar9 = (uint *)((ulong)uVar17 + (long)vl->reg_save_area);
        vl->gp_offset = uVar17 + 8;
      }
      else {
        puVar9 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar9 + 2;
      }
      num = (uint64_t)*puVar9;
      goto LAB_001144d5;
    default:
      if (cVar2 != '%') {
        if (cVar2 != '.') {
          if (cVar2 == '\0') {
            __assert_fail("f[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                          ,0x84,
                          "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
            ;
          }
          goto switchD_00114290_caseD_63;
        }
        if (format[2] != '*') goto switchD_00114290_caseD_63;
        pcVar19 = format + 3;
        if (format[3] == 's') {
          uVar17 = vl->gp_offset;
          uVar13 = (ulong)uVar17;
          if (uVar13 < 0x29) {
            vl->gp_offset = (uint)(uVar13 + 8);
            uVar15 = *(uint *)((long)vl->reg_save_area + uVar13);
            if (0x20 < uVar17) goto LAB_00114692;
            puVar7 = (undefined8 *)(uVar13 + 8 + (long)vl->reg_save_area);
            vl->gp_offset = uVar17 + 0x10;
          }
          else {
            puVar9 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar9 + 2;
            uVar15 = *puVar9;
LAB_00114692:
            puVar7 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar7 + 1;
          }
          iVar3 = 1;
          if ((0x1f < uVar15) && (iVar3 = 2, 0xff < uVar15)) {
            iVar3 = (uint)(0xffff < uVar15) * 2 + 3;
          }
          sVar20 = sVar20 + (iVar3 + uVar15);
          vl = (__va_list_tag *)end;
          if (local_38 < sVar20) break;
          __src = (void *)*puVar7;
          data = mp_encode_strl(data,uVar15);
          sVar10 = (size_t)uVar15;
        }
        else {
          if (format[3] != 'p') goto switchD_00114290_caseD_63;
          uVar17 = vl->gp_offset;
          uVar13 = (ulong)uVar17;
          if (uVar13 < 0x29) {
            vl->gp_offset = (uint)(uVar13 + 8);
            uVar15 = *(uint *)((long)vl->reg_save_area + uVar13);
            if (0x20 < uVar17) goto LAB_001146f6;
            puVar7 = (undefined8 *)(uVar13 + 8 + (long)vl->reg_save_area);
            vl->gp_offset = uVar17 + 0x10;
          }
          else {
            puVar9 = (uint *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar9 + 2;
            uVar15 = *puVar9;
LAB_001146f6:
            puVar7 = (undefined8 *)vl->overflow_arg_area;
            vl->overflow_arg_area = puVar7 + 1;
          }
          if (uVar15 == 0) {
            __assert_fail("len > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.c"
                          ,0xa8,
                          "size_t mp_vformat(char *, size_t, const char *, struct __va_list_tag *)")
            ;
          }
          sVar10 = (size_t)uVar15;
          sVar20 = sVar20 + sVar10;
          vl = (__va_list_tag *)end;
          if (local_38 < sVar20) break;
          __src = (void *)*puVar7;
        }
        memcpy(data,__src,sVar10);
        data = (char *)((byte *)data + sVar10);
        vl = (__va_list_tag *)end;
      }
    }
LAB_00114319:
    format = pcVar19 + 1;
  } while( true );
  pcVar16 = pcVar14 + 2;
  if (pcVar14[2] != '%') {
    bVar18 = iVar3 == 1;
LAB_00114261:
    uVar17 = uVar17 + bVar18;
    pcVar16 = pcVar1;
  }
  goto LAB_001141c4;
LAB_0011419b:
  pcVar16 = pcVar14 + 2;
  if (pcVar14[2] != '%') {
    bVar18 = iVar3 == 1;
LAB_001141b2:
    uVar17 = uVar17 + bVar18;
    pcVar16 = pcVar1;
  }
  goto LAB_00114115;
}

Assistant:

size_t
mp_vformat(char *data, size_t data_size, const char *format, va_list vl)
{
	size_t result = 0;
	const char *f = NULL;

	for (f = format; *f; f++) {
		if (f[0] == '[') {
			uint32_t size = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						size++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '[' must be closed by ']' */
					assert(level || *e == ']');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						size++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					size++;
				}
			}
			/* opened '[' must be closed */
			assert(level == 0);
			result += mp_sizeof_array(size);
			if (result <= data_size)
				data = mp_encode_array(data, size);
		} else if (f[0] == '{') {
			uint32_t count = 0;
			int level = 1;
			const char *e = NULL;

			for (e = f + 1; level && *e; e++) {
				if (*e == '[' || *e == '{') {
					if (level == 1)
						count++;
					level++;
				} else if (*e == ']' || *e == '}') {
					level--;
					/* opened '{' must be closed by '}' */
					assert(level || *e == '}');
				} else if (*e == '%') {
					if (e[1] == '%')
						e++;
					else if (level == 1)
						count++;
				} else if (*e == 'N' && e[1] == 'I'
					   && e[2] == 'L' && level == 1) {
					count++;
				}
			}
			/* opened '{' must be closed */
			assert(level == 0);
			/* since map is a pair list, count must be even */
			assert(count % 2 == 0);
			uint32_t size = count / 2;
			result += mp_sizeof_map(size);
			if (result <= data_size)
				data = mp_encode_map(data, size);
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				result += mp_sizeof_str(len);
				if (result <= data_size)
					data = mp_encode_str(data, str, len);
				f += 2;
			} else if (f[0] == 'p') {
				const char *p = va_arg(vl, const char *);
				const char *end = p;
				mp_next(&end);
				uint32_t len = (uint32_t)(end - p);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 'p') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *p = va_arg(vl, const char *);
				assert(len > 0);
				result += len;
				if (result <= data_size) {
					memcpy(data, p, len);
					data += len;
				}
				f += 2;
			} else if(f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				result += mp_sizeof_float(v);
				if (result <= data_size)
					data = mp_encode_float(data, v);
			} else if(f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				result += mp_sizeof_double(v);
				if (result <= data_size)
					data = mp_encode_double(data, v);
				f++;
			} else if(f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				result += mp_sizeof_bool(v);
				if (result <= data_size)
					data = mp_encode_bool(data, v);
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1 && int_value < 0) {
				result += mp_sizeof_int(int_value);
				if (result <= data_size)
					data = mp_encode_int(data, int_value);
			} else if(int_status) {
				result += mp_sizeof_uint(int_value);
				if (result <= data_size)
					data = mp_encode_uint(data, int_value);
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			result += mp_sizeof_nil();
			if (result <= data_size)
				data = mp_encode_nil(data);
			f += 2;
		}
	}
	return result;
}